

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O2

bool iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>::validate
               (size_t buffer_size,FLAT_FORWARD_LIST_TEST *e)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = e->NextEntryOffset;
  if (uVar1 == 0) {
    uVar1 = e->DataLength + 0x18;
    bVar3 = uVar1 < buffer_size;
    bVar4 = uVar1 == buffer_size;
  }
  else {
    if (buffer_size < uVar1) {
      return false;
    }
    uVar2 = e->DataLength + 0x18;
    bVar3 = uVar2 < uVar1;
    bVar4 = uVar2 == uVar1;
  }
  return bVar3 || bVar4;
}

Assistant:

static bool validate(size_t buffer_size, FLAT_FORWARD_LIST_TEST const &e) noexcept {
            //
            // if this is last element then make sure it fits in the reminder of buffer
            // otherwise make sure that pointer to the next element fits reminder of buffer
            // and this element size fits before next element starts
            //
            // Note that when we evaluate if buffer is valid we are not requiring
            // that it is properly aligned. An implementation can choose to enforce 
            // that
            //
            //
            if (e.NextEntryOffset == 0) {
                return  get_size(e) <= buffer_size;
            } else if (e.NextEntryOffset <= buffer_size) {
                return  get_size(e) <= e.NextEntryOffset;
            }
            return false;
        }